

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void resize_context_buffers(AV1_COMMON *cm,int width,int height)

{
  int iVar1;
  RefCntBuffer *pRVar2;
  int iVar3;
  MV_REF *pMVar4;
  uint8_t *puVar5;
  TPL_MV_REF *pTVar6;
  
  if ((cm->width != width) || (cm->height != height)) {
    if (((cm->mi_params).mi_cols < width + 3 >> 2) || ((cm->mi_params).mi_rows < height + 3 >> 2)) {
      iVar3 = av1_alloc_context_buffers(cm,width,height,BLOCK_4X4);
      if (iVar3 != 0) {
        cm->width = 0;
        cm->height = 0;
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate context buffers");
      }
    }
    else {
      (*(cm->mi_params).set_mb_mi)(&cm->mi_params,width,height,BLOCK_4X4);
    }
    av1_init_mi_buffers(&cm->mi_params);
    cm->width = width;
    cm->height = height;
  }
  pRVar2 = cm->cur_frame;
  if (((pRVar2->mvs == (MV_REF *)0x0) || (pRVar2->mi_rows != (cm->mi_params).mi_rows)) ||
     (pRVar2->mi_cols != (cm->mi_params).mi_cols)) {
    aom_free(pRVar2->mvs);
    iVar3 = (cm->mi_params).mi_rows;
    pRVar2->mi_rows = iVar3;
    iVar1 = (cm->mi_params).mi_cols;
    pRVar2->mi_cols = iVar1;
    pMVar4 = (MV_REF *)aom_calloc((long)((iVar1 + 1 >> 1) * (iVar3 + 1 >> 1)),8);
    pRVar2->mvs = pMVar4;
    if (pMVar4 == (MV_REF *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate buf->mvs");
    }
    aom_free(pRVar2->seg_map);
    puVar5 = (uint8_t *)aom_calloc((long)(cm->mi_params).mi_cols * (long)(cm->mi_params).mi_rows,1);
    pRVar2->seg_map = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate buf->seg_map");
    }
  }
  iVar3 = ((cm->mi_params).mi_stride >> 1) * ((cm->mi_params).mi_rows + 0x20 >> 1);
  if ((cm->tpl_mvs == (TPL_MV_REF *)0x0) || (cm->tpl_mvs_mem_size < iVar3)) {
    aom_free(cm->tpl_mvs);
    pTVar6 = (TPL_MV_REF *)aom_calloc((long)iVar3,8);
    cm->tpl_mvs = pTVar6;
    if (pTVar6 == (TPL_MV_REF *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->tpl_mvs");
    }
    cm->tpl_mvs_mem_size = iVar3;
  }
  iVar3 = cm->height;
  pRVar2 = cm->cur_frame;
  pRVar2->width = cm->width;
  pRVar2->height = iVar3;
  return;
}

Assistant:

static inline void resize_context_buffers(AV1_COMMON *cm, int width,
                                          int height) {
#if CONFIG_SIZE_LIMIT
  if (width > DECODE_WIDTH_LIMIT || height > DECODE_HEIGHT_LIMIT)
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Dimensions of %dx%d beyond allowed size of %dx%d.",
                       width, height, DECODE_WIDTH_LIMIT, DECODE_HEIGHT_LIMIT);
#endif
  if (cm->width != width || cm->height != height) {
    const int new_mi_rows = CEIL_POWER_OF_TWO(height, MI_SIZE_LOG2);
    const int new_mi_cols = CEIL_POWER_OF_TWO(width, MI_SIZE_LOG2);

    // Allocations in av1_alloc_context_buffers() depend on individual
    // dimensions as well as the overall size.
    if (new_mi_cols > cm->mi_params.mi_cols ||
        new_mi_rows > cm->mi_params.mi_rows) {
      if (av1_alloc_context_buffers(cm, width, height, BLOCK_4X4)) {
        // The cm->mi_* values have been cleared and any existing context
        // buffers have been freed. Clear cm->width and cm->height to be
        // consistent and to force a realloc next time.
        cm->width = 0;
        cm->height = 0;
        aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate context buffers");
      }
    } else {
      cm->mi_params.set_mb_mi(&cm->mi_params, width, height, BLOCK_4X4);
    }
    av1_init_mi_buffers(&cm->mi_params);
    cm->width = width;
    cm->height = height;
  }

  ensure_mv_buffer(cm->cur_frame, cm);
  cm->cur_frame->width = cm->width;
  cm->cur_frame->height = cm->height;
}